

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

bool __thiscall Instance::solve(Instance *this)

{
  check_result cVar1;
  clock_t cVar2;
  clock_t cVar3;
  params *in_RDI;
  bool bVar4;
  bool result;
  params p;
  clock_t c_end;
  clock_t c_start;
  context *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffb4;
  optimize *this_00;
  uint in_stack_ffffffffffffffd4;
  object in_stack_ffffffffffffffd8;
  params *in_stack_ffffffffffffffe0;
  
  cVar2 = clock();
  (**(code **)(in_RDI->super_object).m_ctx)();
  cVar3 = clock();
  in_RDI->m_params =
       (Z3_params)((double)in_RDI->m_params + ((double)(cVar3 - cVar2) * 1000.0) / 1000000.0);
  this_00 = (optimize *)&stack0xffffffffffffffd8;
  z3::params::params((params *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  z3::params::set(in_stack_ffffffffffffffe0,&(in_stack_ffffffffffffffd8.m_ctx)->m_enable_exceptions,
                  in_stack_ffffffffffffffd4);
  z3::optimize::set(this_00,in_RDI);
  cVar2 = clock();
  cVar1 = z3::optimize::check((optimize *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  bVar4 = cVar1 == sat;
  cVar3 = clock();
  in_RDI[1].super_object.m_ctx =
       (context *)
       (((double)(cVar3 - cVar2) * 1000.0) / 1000000.0 + (double)in_RDI[1].super_object.m_ctx);
  uVar5 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffffb0);
  z3::params::~params((params *)CONCAT44(cVar1,uVar5));
  return (bool)((byte)((uint)uVar5 >> 0x18) & 1);
}

Assistant:

bool Instance::solve() {
  std::clock_t c_start = std::clock();
  enforceConstraints();
  std::clock_t c_end = std::clock();
  constraint_t += 1000.0 * (c_end - c_start) / CLOCKS_PER_SEC;

  z3::params p(*c);
  p.set(":timeout", static_cast<unsigned>(1000*60)); //1 minute timout
  solver.set(p);
  c_start = std::clock();
  bool result = solver.check() == sat;
  c_end = std::clock();
  solve_t += 1000.0 * (c_end - c_start) / CLOCKS_PER_SEC;
  return result;
}